

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::unwrap(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Sys *this,Token *token)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  optional<Vault::HttpResponse> response;
  allocator<char> local_16a;
  allocator<char> local_169;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  char local_158 [8];
  undefined8 uStack_150;
  Path local_148;
  string local_128 [32];
  string local_108 [32];
  Url local_e8;
  _Optional_payload_base<Vault::HttpResponse> local_c8;
  _Optional_payload_base<Vault::HttpResponse> local_78;
  
  iVar2 = (*this->client_->_vptr_Client[10])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"wrapping/unwrap",&local_169);
  local_148.value_._M_dataplus._M_p = (pointer)&local_148.value_.field_2;
  if (local_168 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158) {
    local_148.value_.field_2._8_8_ = uStack_150;
  }
  else {
    local_148.value_._M_dataplus._M_p = (pointer)local_168;
  }
  local_148.value_._M_string_length = local_160;
  local_160 = 0;
  local_158[0] = '\0';
  local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158;
  getUrl(&local_e8,this,&local_148);
  (*this->client_->_vptr_Client[9])(local_108);
  std::__cxx11::string::string<std::allocator<char>>(local_128,"",&local_16a);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            (&local_c8,(long *)CONCAT44(extraout_var,iVar2),&local_e8,token,local_108,local_128);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::_Optional_base<Vault::HttpResponse,_false,_false>::_Optional_base
            ((_Optional_base<Vault::HttpResponse,_false,_false> *)&local_78,
             (_Optional_base<Vault::HttpResponse,_false,_false> *)&local_c8);
  bVar1 = HttpClient::is_success((optional<Vault::HttpResponse> *)&local_78);
  std::_Optional_payload_base<Vault::HttpResponse>::_M_reset(&local_78);
  if (bVar1) {
    if (local_c8._M_engaged == false) {
LAB_0019ce1c:
      std::__throw_bad_optional_access();
    }
    std::_Optional_payload_base<std::__cxx11::string>::
    _Optional_payload_base<std::__cxx11::string_const&>
              ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
               (undefined1 *)((long)&local_c8._M_payload + 0x28));
  }
  else {
    if (local_c8._M_engaged != false) {
      iVar2 = (*this->client_->_vptr_Client[10])();
      if (local_c8._M_engaged == false) goto LAB_0019ce1c;
      HttpClient::handleResponseError
                ((HttpClient *)CONCAT44(extraout_var_00,iVar2),(HttpResponse *)&local_c8);
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  std::_Optional_payload_base<Vault::HttpResponse>::_M_reset(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::unwrap(const Token &token) {
  auto response = client_.getHttpClient().post(
      getUrl(Path{"wrapping/unwrap"}), token, client_.getNamespace(), "");

  if (HttpClient::is_success(response)) {
    return {response.value().body.value()};
  }

  if (response) {
    client_.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}